

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O2

optional<InotifyEvent> * __thiscall
NonrecursiveInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,NonrecursiveInotifyPoller *this)

{
  string *this_00;
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  size_t sVar4;
  char *pcVar5;
  allocator local_89;
  inotify_event ev;
  InotifyEvent event;
  string local_48 [32];
  
  pcVar5 = this->read_buffer_;
  do {
    uVar2 = this->read_buffer_length_;
    sVar4 = this->read_buffer_offset_;
    if (uVar2 < sVar4 + 0x10) {
      uVar2 = read(this->fd_,pcVar5,0x10000);
      if (uVar2 == 0xffffffffffffffff) {
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0.
                   _M_payload.path.field_2 + 8) = 0;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          ._M_string_length = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          .field_2._M_allocated_capacity = 0;
          *(undefined8 *)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0
               = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          ._M_dataplus._M_p = (pointer)0x0;
          return __return_storage_ptr__;
        }
      }
      else if (0xf < (long)uVar2) {
        this->read_buffer_offset_ = 0;
        this->read_buffer_length_ = uVar2;
        sVar4 = 0;
        goto LAB_0012eb53;
      }
      pcVar5 = "readlen >= (ssize_t)sizeof(struct inotify_event) && \"inotify read failed\"";
      uVar1 = 0x38;
      goto LAB_0012ece2;
    }
LAB_0012eb53:
    ev._0_8_ = *(undefined8 *)(pcVar5 + sVar4);
    ev._8_8_ = *(undefined8 *)(pcVar5 + sVar4 + 8);
    this->read_buffer_offset_ = sVar4 + 0x10;
    if (uVar2 < sVar4 + 0x10) {
      pcVar5 = "read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\"";
      uVar1 = 0x41;
      goto LAB_0012ece2;
    }
    if ((short)ev.mask < 0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&(this->directories_)._M_t,&ev.wd);
    }
    if ((ev.mask >> 0xe & 1) != 0) {
      this->events_dropped_ = true;
    }
  } while (ev.len == 0);
  event.path._M_dataplus._M_p = (pointer)&event.path.field_2;
  event.path._M_string_length = 0;
  event.path.field_2._M_local_buf[0] = '\0';
  uVar1 = ev.mask & 0xfff;
  if (uVar1 == 2) {
    event.type = MODIFIED;
  }
  else if (uVar1 == 0x40) {
LAB_0012ec00:
    event.type = DELETED;
  }
  else {
    if (uVar1 != 0x80) {
      if (uVar1 == 0x200) goto LAB_0012ec00;
      if (uVar1 != 0x100) {
        pcVar5 = "0 && \"Unknown event type\"";
        uVar1 = 0x5c;
        goto LAB_0012ece2;
      }
    }
    event.type = CREATED;
  }
  this_00 = &event.path;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&this->directories_,&ev.wd);
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::string(local_48,pcVar5 + this->read_buffer_offset_,&local_89);
  std::__cxx11::string::append((string *)this_00);
  std::__cxx11::string::~string(local_48);
  if ((ev._0_8_ & 0x4000000000000000) != 0) {
    std::__cxx11::string::push_back((char)this_00);
  }
  uVar2 = ((ulong)ev._8_8_ >> 0x20) + this->read_buffer_offset_;
  this->read_buffer_offset_ = uVar2;
  if (uVar2 <= this->read_buffer_length_) {
    std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::
    _Optional_base<InotifyEvent>
              (&__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>,&event);
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  pcVar5 = "read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\"";
  uVar1 = 0x66;
LAB_0012ece2:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,uVar1,
                "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
               );
}

Assistant:

std::experimental::optional<InotifyEvent>
NonrecursiveInotifyPoller::GetNextEvent() {
  struct inotify_event ev;
  for (;;) {
    // Read new events from the kernel if needed.
    if (read_buffer_offset_ + sizeof(struct inotify_event) >
        read_buffer_length_) {
      ssize_t readlen = read(fd_, read_buffer_, sizeof(read_buffer_));
      if (readlen == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))
        return {};
      assert(readlen >= (ssize_t)sizeof(struct inotify_event) &&
             "inotify read failed");
      read_buffer_offset_ = 0;
      read_buffer_length_ = readlen;
    }

    // Copy next event from read buffer to get the alignment right.
    memcpy(&ev, read_buffer_ + read_buffer_offset_, sizeof(ev));
    read_buffer_offset_ += sizeof(ev);
    assert(read_buffer_offset_ <= read_buffer_length_ &&
           "Attempted to escape read buffer");

    // If the kernel is going to discard this watch, remove it from our
    // bookkeeping as well.
    if ((ev.mask & IN_IGNORED) != 0)
      directories_.erase(ev.wd);

    // Record that we've been dropping events.
    if ((ev.mask & IN_Q_OVERFLOW) != 0)
      events_dropped_ = true;

    if (ev.len > 0) {
      // Extract the event type.
      InotifyEvent event;
      switch (ev.mask & IN_ALL_EVENTS) {
        case IN_CREATE:
        case IN_MOVED_TO:
          event.type = InotifyEventType::CREATED;
          break;
        case IN_DELETE:
        case IN_MOVED_FROM:
          event.type = InotifyEventType::DELETED;
          break;
        case IN_MODIFY:
          event.type = InotifyEventType::MODIFIED;
          break;
        default:
          assert(0 && "Unknown event type");
      }

      // Extract the pathname string.
      event.path = directories_[ev.wd];
      event.path += std::string(read_buffer_ + read_buffer_offset_);
      if ((ev.mask & IN_ISDIR) != 0)
        event.path += '/';
      read_buffer_offset_ += ev.len;
      assert(read_buffer_offset_ <= read_buffer_length_ &&
             "Attempted to escape read buffer");
      return event;
    }
  }
}